

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa_io.c
# Opt level: O0

void * IDAGetAdjIDABmem(void *ida_mem,int which)

{
  int in_ESI;
  IDAMem in_RDI;
  void *ida_memB;
  IDABMem IDAB_mem;
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMemRec *local_30;
  IDAMem local_8;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,0,0x248,"IDAGetAdjIDABmem",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa_io.c"
                    ,"ida_mem = NULL illegal.");
    local_8 = (IDAMem)0x0;
  }
  else if (in_RDI->ida_adjMallocDone == 0) {
    IDAProcessError(in_RDI,0,0x250,"IDAGetAdjIDABmem",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa_io.c"
                    ,"Illegal attempt to call before calling IDAadjInit.");
    local_8 = (IDAMem)0x0;
  }
  else if (in_ESI < in_RDI->ida_adj_mem->ia_nbckpbs) {
    for (local_30 = in_RDI->ida_adj_mem->IDAB_mem;
        (local_30 != (IDABMemRec *)0x0 && (in_ESI != local_30->ida_index));
        local_30 = local_30->ida_next) {
    }
    local_8 = local_30->IDA_mem;
  }
  else {
    IDAProcessError(in_RDI,0,600,"IDAGetAdjIDABmem",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa_io.c"
                    ,"Illegal value for which.");
    local_8 = (IDAMem)0x0;
  }
  return local_8;
}

Assistant:

void* IDAGetAdjIDABmem(void* ida_mem, int which)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  void* ida_memB;

  /* Is ida_mem valid? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSGAM_NULL_IDAMEM);
    return (NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, 0, __LINE__, __func__, __FILE__, MSGAM_NO_ADJ);
    return (NULL);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, 0, __LINE__, __func__, __FILE__, MSGAM_BAD_WHICH);
    return (NULL);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    /* advance */
    IDAB_mem = IDAB_mem->ida_next;
  }
  ida_memB = (void*)IDAB_mem->IDA_mem;

  return (ida_memB);
}